

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O2

int encode_long_value(AMQPVALUE_ENCODER_OUTPUT encoder_output,void *context,int64_t value,
                     _Bool use_smallest)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  undefined7 in_register_00000009;
  char *pcVar4;
  uchar local_21;
  uchar local_20;
  uchar local_1f;
  uchar local_1e;
  uchar local_1d;
  uchar local_1c;
  uchar local_1b;
  uchar local_1a;
  uchar local_19;
  
  if ((int)CONCAT71(in_register_00000009,use_smallest) == 0) {
    local_1f = (uchar)((ulong)value >> 0x38);
    iVar1 = (*encoder_output)(context,&local_1f,1);
    if (iVar1 == 0) {
      local_1e = (uchar)((ulong)value >> 0x30);
      iVar1 = (*encoder_output)(context,&local_1e,1);
      if (iVar1 == 0) {
        local_1d = (uchar)((ulong)value >> 0x28);
        iVar1 = (*encoder_output)(context,&local_1d,1);
        if (iVar1 == 0) {
          local_1c = (uchar)((ulong)value >> 0x20);
          iVar1 = (*encoder_output)(context,&local_1c,1);
          if (iVar1 == 0) {
            local_1b = (uchar)((ulong)value >> 0x18);
            iVar1 = (*encoder_output)(context,&local_1b,1);
            if (iVar1 == 0) {
              local_1a = (uchar)((ulong)value >> 0x10);
              iVar1 = (*encoder_output)(context,&local_1a,1);
              if (iVar1 == 0) {
                local_21 = (uchar)((ulong)value >> 8);
                iVar1 = (*encoder_output)(context,&local_21,1);
                if ((iVar1 == 0) &&
                   (local_19 = (uchar)value, iVar1 = (*encoder_output)(context,&local_19,1),
                   iVar1 == 0)) {
                  return 0;
                }
              }
            }
          }
        }
      }
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0xc1e;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0xc1e;
    }
    pcVar4 = "Failed encoding long value";
    iVar3 = 0xc1d;
  }
  else {
    local_20 = (uchar)value;
    iVar1 = (*encoder_output)(context,&local_20,1);
    if (iVar1 == 0) {
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0xc08;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0xc08;
    }
    pcVar4 = "Failed encoding small long value";
    iVar3 = 0xc07;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
            ,"encode_long_value",iVar3,1,pcVar4);
  return iVar1;
}

Assistant:

static int encode_long_value(AMQPVALUE_ENCODER_OUTPUT encoder_output, void* context, int64_t value, bool use_smallest)
{
    int result;

    if (use_smallest)
    {
        /* Codes_SRS_AMQPVALUE_01_288: [<encoding name="smalllong" code="0x55" category="fixed" width="1" label="8-bit two's-complement integer"/>] */
        if (output_byte(encoder_output, context, value & 0xFF) != 0)
        {
            /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
            LogError("Failed encoding small long value");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
            result = 0;
        }
    }
    else
    {
        /* Codes_SRS_AMQPVALUE_01_287: [<encoding code="0x81" category="fixed" width="8" label="64-bit two's-complement integer in network byte order"/>] */
        if ((output_byte(encoder_output, context, (value >> 56) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (value >> 48) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (value >> 40) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (value >> 32) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (value >> 24) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (value >> 16) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (value >> 8) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, value & 0xFF) != 0))
        {
            /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
            LogError("Failed encoding long value");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
            result = 0;
        }
    }

    return result;
}